

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer_interface.cc
# Opt level: O0

TrainerInterface * __thiscall
sentencepiece::TrainerInterface::InitMetaPieces(TrainerInterface *this)

{
  bool bVar1;
  int32 iVar2;
  StatusBuilder *pSVar3;
  string *psVar4;
  reference pbVar5;
  long in_RSI;
  string local_a30 [39];
  byte local_a09;
  int local_a08;
  byte local_a01;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *w_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *w;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  anon_class_24_3_df37360f insert_meta_symbol;
  undefined1 local_998 [4];
  int id;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dup;
  StatusBuilder local_960;
  int local_7dc;
  StatusBuilder local_7d8;
  int local_654;
  StatusBuilder local_650;
  int local_4cc;
  StatusBuilder local_4c8;
  int local_344;
  StatusBuilder local_340;
  undefined1 local_1c0 [8];
  anon_class_16_2_878a7968 insert_id;
  int local_1a8;
  bool has_unk;
  StatusBuilder local_198;
  TrainerInterface *this_local;
  Status *_status;
  
  this_local = this;
  bVar1 = std::
          map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::ModelProto_SentencePiece_Type>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::ModelProto_SentencePiece_Type>_>_>_>
          ::empty((map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::ModelProto_SentencePiece_Type>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::ModelProto_SentencePiece_Type>_>_>_>
                   *)(in_RSI + 0x260));
  if (bVar1) {
    insert_id.this._7_1_ = 0;
    local_1c0 = (undefined1  [8])((long)&insert_id.this + 7);
    iVar2 = TrainerSpec::unk_id((TrainerSpec *)(in_RSI + 0x70));
    psVar4 = TrainerSpec::unk_piece_abi_cxx11_((TrainerSpec *)(in_RSI + 0x70));
    bVar1 = InitMetaPieces::anon_class_16_2_878a7968::operator()
                      ((anon_class_16_2_878a7968 *)local_1c0,iVar2,psVar4);
    if (bVar1) {
      iVar2 = TrainerSpec::bos_id((TrainerSpec *)(in_RSI + 0x70));
      psVar4 = TrainerSpec::bos_piece_abi_cxx11_((TrainerSpec *)(in_RSI + 0x70));
      bVar1 = InitMetaPieces::anon_class_16_2_878a7968::operator()
                        ((anon_class_16_2_878a7968 *)local_1c0,iVar2,psVar4);
      if (bVar1) {
        iVar2 = TrainerSpec::eos_id((TrainerSpec *)(in_RSI + 0x70));
        psVar4 = TrainerSpec::eos_piece_abi_cxx11_((TrainerSpec *)(in_RSI + 0x70));
        bVar1 = InitMetaPieces::anon_class_16_2_878a7968::operator()
                          ((anon_class_16_2_878a7968 *)local_1c0,iVar2,psVar4);
        if (bVar1) {
          iVar2 = TrainerSpec::pad_id((TrainerSpec *)(in_RSI + 0x70));
          psVar4 = TrainerSpec::pad_piece_abi_cxx11_((TrainerSpec *)(in_RSI + 0x70));
          bVar1 = InitMetaPieces::anon_class_16_2_878a7968::operator()
                            ((anon_class_16_2_878a7968 *)local_1c0,iVar2,psVar4);
          if (bVar1) {
            if ((insert_id.this._7_1_ & 1) == 0) {
              util::StatusBuilder::StatusBuilder(&local_960,kInternal);
              pSVar3 = util::StatusBuilder::operator<<
                                 (&local_960,(char (*) [25])"src/trainer_interface.cc");
              pSVar3 = util::StatusBuilder::operator<<(pSVar3,(char (*) [2])0x3a86b0);
              dup._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0x2f8;
              pSVar3 = util::StatusBuilder::operator<<
                                 (pSVar3,(int *)((long)&dup._M_t._M_impl.super__Rb_tree_header.
                                                        _M_node_count + 4));
              pSVar3 = util::StatusBuilder::operator<<(pSVar3,(char (*) [4])") [");
              pSVar3 = util::StatusBuilder::operator<<(pSVar3,(char (*) [8])"has_unk");
              pSVar3 = util::StatusBuilder::operator<<(pSVar3,(char (*) [3])"] ");
              psVar4 = TrainerSpec::unk_piece_abi_cxx11_((TrainerSpec *)(in_RSI + 0x70));
              pSVar3 = util::StatusBuilder::operator<<(pSVar3,psVar4);
              util::StatusBuilder::operator<<(pSVar3,(char (*) [18])" must be defined.");
              util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
              util::StatusBuilder::~StatusBuilder(&local_960);
            }
            else {
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_998);
              insert_meta_symbol.this._4_4_ = 0;
              __range1 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)&insert_meta_symbol.this + 4);
              insert_meta_symbol.id = (int *)local_998;
              TrainerSpec::control_symbols_abi_cxx11_((TrainerSpec *)(in_RSI + 0x70));
              ___end1 = google::protobuf::RepeatedPtrField<std::__cxx11::string>::begin();
              w = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  google::protobuf::RepeatedPtrField<std::__cxx11::string>::end();
              while (bVar1 = google::protobuf::internal::
                             RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator!=(&__end1,(iterator *)&w), bVar1) {
                pbVar5 = google::protobuf::internal::
                         RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&__end1);
                InitMetaPieces::anon_class_24_3_df37360f::operator()
                          ((anon_class_24_3_df37360f *)this,(string *)&__range1,(Type)pbVar5);
                bVar1 = util::Status::ok((Status *)this);
                if (!bVar1) goto LAB_002431d3;
                sentencepiece::util::Status::~Status((Status *)this);
                google::protobuf::internal::
                RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&__end1);
              }
              TrainerSpec::user_defined_symbols_abi_cxx11_((TrainerSpec *)(in_RSI + 0x70));
              ___end1_1 = google::protobuf::RepeatedPtrField<std::__cxx11::string>::begin();
              w_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    google::protobuf::RepeatedPtrField<std::__cxx11::string>::end();
              while (bVar1 = google::protobuf::internal::
                             RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator!=(&__end1_1,(iterator *)&w_1), bVar1) {
                _i = google::protobuf::internal::
                     RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end1_1);
                local_a01 = 0;
                InitMetaPieces::anon_class_24_3_df37360f::operator()
                          ((anon_class_24_3_df37360f *)this,(string *)&__range1,(Type)_i);
                bVar1 = util::Status::ok((Status *)this);
                if (!bVar1) {
                  local_a01 = 1;
                }
                if ((local_a01 & 1) == 0) {
                  sentencepiece::util::Status::~Status((Status *)this);
                }
                if (!bVar1) goto LAB_002431d3;
                google::protobuf::internal::
                RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&__end1_1);
              }
              bVar1 = TrainerSpec::byte_fallback((TrainerSpec *)(in_RSI + 0x70));
              if (bVar1) {
                for (local_a08 = 0; local_a08 < 0x100; local_a08 = local_a08 + 1) {
                  local_a09 = 0;
                  sentencepiece::ByteToPiece_abi_cxx11_((uchar)local_a30);
                  InitMetaPieces::anon_class_24_3_df37360f::operator()
                            ((anon_class_24_3_df37360f *)this,(string *)&__range1,(Type)local_a30);
                  std::__cxx11::string::~string(local_a30);
                  bVar1 = util::Status::ok((Status *)this);
                  if (!bVar1) {
                    local_a09 = 1;
                  }
                  if ((local_a09 & 1) == 0) {
                    sentencepiece::util::Status::~Status((Status *)this);
                  }
                  if (!bVar1) goto LAB_002431d3;
                }
              }
              util::OkStatus();
LAB_002431d3:
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_998);
            }
          }
          else {
            util::StatusBuilder::StatusBuilder(&local_7d8,kInternal);
            pSVar3 = util::StatusBuilder::operator<<
                               (&local_7d8,(char (*) [25])"src/trainer_interface.cc");
            pSVar3 = util::StatusBuilder::operator<<(pSVar3,(char (*) [2])0x3a86b0);
            local_7dc = 0x2f6;
            pSVar3 = util::StatusBuilder::operator<<(pSVar3,&local_7dc);
            pSVar3 = util::StatusBuilder::operator<<(pSVar3,(char (*) [4])") [");
            pSVar3 = util::StatusBuilder::operator<<
                               (pSVar3,(char (*) [61])
                                       "insert_id(trainer_spec_.pad_id(), trainer_spec_.pad_piece())"
                               );
            util::StatusBuilder::operator<<(pSVar3,(char (*) [3])"] ");
            util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
            util::StatusBuilder::~StatusBuilder(&local_7d8);
          }
        }
        else {
          util::StatusBuilder::StatusBuilder(&local_650,kInternal);
          pSVar3 = util::StatusBuilder::operator<<
                             (&local_650,(char (*) [25])"src/trainer_interface.cc");
          pSVar3 = util::StatusBuilder::operator<<(pSVar3,(char (*) [2])0x3a86b0);
          local_654 = 0x2f5;
          pSVar3 = util::StatusBuilder::operator<<(pSVar3,&local_654);
          pSVar3 = util::StatusBuilder::operator<<(pSVar3,(char (*) [4])") [");
          pSVar3 = util::StatusBuilder::operator<<
                             (pSVar3,(char (*) [61])
                                     "insert_id(trainer_spec_.eos_id(), trainer_spec_.eos_piece())")
          ;
          util::StatusBuilder::operator<<(pSVar3,(char (*) [3])"] ");
          util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
          util::StatusBuilder::~StatusBuilder(&local_650);
        }
      }
      else {
        util::StatusBuilder::StatusBuilder(&local_4c8,kInternal);
        pSVar3 = util::StatusBuilder::operator<<
                           (&local_4c8,(char (*) [25])"src/trainer_interface.cc");
        pSVar3 = util::StatusBuilder::operator<<(pSVar3,(char (*) [2])0x3a86b0);
        local_4cc = 0x2f4;
        pSVar3 = util::StatusBuilder::operator<<(pSVar3,&local_4cc);
        pSVar3 = util::StatusBuilder::operator<<(pSVar3,(char (*) [4])") [");
        pSVar3 = util::StatusBuilder::operator<<
                           (pSVar3,(char (*) [61])
                                   "insert_id(trainer_spec_.bos_id(), trainer_spec_.bos_piece())");
        util::StatusBuilder::operator<<(pSVar3,(char (*) [3])"] ");
        util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
        util::StatusBuilder::~StatusBuilder(&local_4c8);
      }
    }
    else {
      util::StatusBuilder::StatusBuilder(&local_340,kInternal);
      pSVar3 = util::StatusBuilder::operator<<(&local_340,(char (*) [25])"src/trainer_interface.cc")
      ;
      pSVar3 = util::StatusBuilder::operator<<(pSVar3,(char (*) [2])0x3a86b0);
      local_344 = 0x2f3;
      pSVar3 = util::StatusBuilder::operator<<(pSVar3,&local_344);
      pSVar3 = util::StatusBuilder::operator<<(pSVar3,(char (*) [4])") [");
      pSVar3 = util::StatusBuilder::operator<<
                         (pSVar3,(char (*) [61])
                                 "insert_id(trainer_spec_.unk_id(), trainer_spec_.unk_piece())");
      util::StatusBuilder::operator<<(pSVar3,(char (*) [3])"] ");
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
      util::StatusBuilder::~StatusBuilder(&local_340);
    }
  }
  else {
    util::StatusBuilder::StatusBuilder(&local_198,kInternal);
    pSVar3 = util::StatusBuilder::operator<<(&local_198,(char (*) [25])"src/trainer_interface.cc");
    pSVar3 = util::StatusBuilder::operator<<(pSVar3,(char (*) [2])0x3a86b0);
    local_1a8 = 0x2e3;
    pSVar3 = util::StatusBuilder::operator<<(pSVar3,&local_1a8);
    pSVar3 = util::StatusBuilder::operator<<(pSVar3,(char (*) [4])") [");
    pSVar3 = util::StatusBuilder::operator<<(pSVar3,(char (*) [21])"meta_pieces_.empty()");
    util::StatusBuilder::operator<<(pSVar3,(char (*) [3])"] ");
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    util::StatusBuilder::~StatusBuilder(&local_198);
  }
  return this;
}

Assistant:

util::Status TrainerInterface::InitMetaPieces() {
  CHECK_OR_RETURN(meta_pieces_.empty());
  bool has_unk = false;

  auto insert_id = [&has_unk, this](int id, const std::string &w) -> bool {
    if (id < 0) return true;
    if (id >= trainer_spec_.vocab_size() ||
        meta_pieces_.find(id) != meta_pieces_.end() ||
        (has_unk && w == trainer_spec_.unk_piece()))
      return false;
    if (w == trainer_spec_.unk_piece()) has_unk = true;
    meta_pieces_[id] = std::make_pair(
        w, w == trainer_spec_.unk_piece() ? ModelProto::SentencePiece::UNKNOWN
                                          : ModelProto::SentencePiece::CONTROL);
    return true;
  };

  CHECK_OR_RETURN(insert_id(trainer_spec_.unk_id(), trainer_spec_.unk_piece()));
  CHECK_OR_RETURN(insert_id(trainer_spec_.bos_id(), trainer_spec_.bos_piece()));
  CHECK_OR_RETURN(insert_id(trainer_spec_.eos_id(), trainer_spec_.eos_piece()));
  CHECK_OR_RETURN(insert_id(trainer_spec_.pad_id(), trainer_spec_.pad_piece()));

  CHECK_OR_RETURN(has_unk) << trainer_spec_.unk_piece() << " must be defined.";

  std::set<std::string> dup;

  int id = 0;
  auto insert_meta_symbol =
      [&id, &dup, this](const std::string &w,
                        ModelProto::SentencePiece::Type type) -> util::Status {
    if (!dup.insert(w).second) {
      return util::InternalError(absl::StrCat(
          w, " is already defined. duplicated symbols are not allowed."));
    }

    if (w == trainer_spec_.unk_piece()) {
      return util::InternalError(
          absl::StrCat(trainer_spec_.unk_piece(),
                       " must not be defined with --control_symbols and "
                       "--user_defined_symbols."));
    }

    if (w == trainer_spec_.bos_piece() && trainer_spec_.bos_id() >= 0) {
      meta_pieces_[trainer_spec_.bos_id()].second = type;
    } else if (w == trainer_spec_.eos_piece() && trainer_spec_.eos_id() >= 0) {
      meta_pieces_[trainer_spec_.eos_id()].second = type;
    } else if (w == trainer_spec_.pad_piece() && trainer_spec_.pad_id() >= 0) {
      meta_pieces_[trainer_spec_.pad_id()].second = type;
    } else {
      while (meta_pieces_.find(id) != meta_pieces_.end()) ++id;
      meta_pieces_[id] = std::make_pair(w, type);
    }

    return util::OkStatus();
  };

  for (const auto &w : trainer_spec_.control_symbols()) {
    RETURN_IF_ERROR(insert_meta_symbol(w, ModelProto::SentencePiece::CONTROL));
  }

  for (const auto &w : trainer_spec_.user_defined_symbols()) {
    RETURN_IF_ERROR(
        insert_meta_symbol(w, ModelProto::SentencePiece::USER_DEFINED));
  }

  if (trainer_spec_.byte_fallback()) {
    for (int i = 0; i < 256; ++i) {
      RETURN_IF_ERROR(
          insert_meta_symbol(ByteToPiece(i), ModelProto::SentencePiece::BYTE));
    }
  }

  return util::OkStatus();
}